

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactor<double>::solveRight
          (SLUFactor<double> *this,VectorBase<double> *x,VectorBase<double> *b)

{
  double *vec;
  double *pdVar1;
  vector<double,_std::allocator<double>_> *__range2;
  
  (*this->solveTime->_vptr_Timer[3])();
  VectorBase<double>::operator=(&this->vec,b);
  vec = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start;
  pdVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (vec != pdVar1) {
    memset(vec,0,(long)pdVar1 - (long)vec & 0xfffffffffffffff8);
  }
  CLUFactor<double>::solveRight
            (&this->super_CLUFactor<double>,vec,
             (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveRight(VectorBase<R>& x, const VectorBase<R>& b) //const
{

   this->solveTime->start();

   this->vec = b;
   x.clear();
   CLUFactor<R>::solveRight(x.get_ptr(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}